

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NewtFile.c
# Opt level: O0

newtRef NsLoad(newtRefArg rcvr,newtRefArg r)

{
  _Bool _Var1;
  newtRef v;
  newtRefVar fn;
  newtRefVar result;
  newtRefArg r_local;
  newtRefArg rcvr_local;
  
  fn = 0xfff2;
  v = NsCompileFile(rcvr,r);
  _Var1 = NewtRefIsNotNIL(v);
  if (_Var1) {
    fn = NVMCall(v,0,(newtErr *)0x0);
  }
  return fn;
}

Assistant:

newtRef NsLoad(newtRefArg rcvr, newtRefArg r)
{
    newtRefVar  result = kNewtRefUnbind;
    newtRefVar	fn;
    
    fn = NsCompileFile(rcvr, r);
    
    if (NewtRefIsNotNIL(fn))
        result = NVMCall(fn, 0, NULL);
    
    return result;
}